

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_mark.cpp
# Opt level: O3

void duckdb::MarkJoinComparisonSwitch
               (Vector *left,Vector *right,idx_t lcount,idx_t rcount,bool *found_match,
               ExpressionType comparison_type)

{
  PhysicalType PVar1;
  ulong uVar2;
  idx_t iVar3;
  ulong uVar4;
  ulong uVar5;
  InternalException *this;
  NotImplementedException *pNVar6;
  idx_t iVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  idx_t iVar11;
  bool bVar12;
  bool bVar13;
  UnifiedVectorFormat right_data;
  Vector left_reference;
  undefined1 local_100 [16];
  SelectionVector local_f0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  undefined1 local_b8 [8];
  undefined1 local_b0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  data_ptr_t local_50;
  LogicalType local_48;
  
  PVar1 = (left->type).physical_type_;
  if ((PVar1 < 0x1e) && ((0x21800000U >> (PVar1 & 0x1f) & 1) != 0)) {
    LogicalType::LogicalType(&local_48,&left->type);
    Vector::Vector((Vector *)local_b8,&local_48,0x800);
    LogicalType::~LogicalType(&local_48);
    if (lcount != 0) {
      iVar7 = 0;
      do {
        if (found_match[iVar7] == false) {
          ConstantVector::Reference((Vector *)local_b8,left,iVar7,rcount);
          switch(comparison_type) {
          case COMPARE_BOUNDARY_START:
            iVar3 = VectorOperations::Equals
                              ((Vector *)local_b8,right,
                               (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::ValidityMask,_true>)0x0);
            break;
          case COMPARE_NOTEQUAL:
            iVar3 = VectorOperations::NotEquals
                              ((Vector *)local_b8,right,
                               (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::ValidityMask,_true>)0x0);
            break;
          case COMPARE_LESSTHAN:
            iVar3 = VectorOperations::LessThan
                              ((Vector *)local_b8,right,
                               (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::ValidityMask,_true>)0x0);
            break;
          case COMPARE_GREATERTHAN:
            iVar3 = VectorOperations::GreaterThan
                              ((Vector *)local_b8,right,
                               (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::ValidityMask,_true>)0x0);
            break;
          case COMPARE_LESSTHANOREQUALTO:
            iVar3 = VectorOperations::LessThanEquals
                              ((Vector *)local_b8,right,
                               (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::ValidityMask,_true>)0x0);
            break;
          case COMPARE_GREATERTHANOREQUALTO:
            iVar3 = VectorOperations::GreaterThanEquals
                              ((Vector *)local_b8,right,
                               (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::ValidityMask,_true>)0x0);
            break;
          default:
            this = (InternalException *)__cxa_allocate_exception(0x10);
            local_100._0_8_ = local_f0;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_100,"Unsupported comparison type for MarkJoinNested","");
            InternalException::InternalException(this,(string *)local_100);
            __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          case COMPARE_DISTINCT_FROM:
            iVar3 = VectorOperations::DistinctFrom
                              ((Vector *)local_b8,right,
                               (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0);
            break;
          case COMPARE_BOUNDARY_END:
            iVar3 = VectorOperations::NotDistinctFrom
                              ((Vector *)local_b8,right,
                               (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0);
          }
          if (iVar3 != 0) {
            found_match[iVar7] = true;
          }
        }
        iVar7 = iVar7 + 1;
      } while (lcount != iVar7);
    }
    if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
    }
    if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
    }
    if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)local_b0);
  }
  else {
    switch(comparison_type) {
    case COMPARE_BOUNDARY_START:
      if (PVar1 < VARCHAR) {
        switch(PVar1) {
        case BOOL:
        case INT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b72cf;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b72cf:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(data_ptr_t)(local_b0._0_8_ + uVar5) ==
                        *(data_t *)(local_100._8_8_ + uVar4))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bc207;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bc207:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(data_ptr_t)(local_b0._0_8_ + uVar5) ==
                        *(data_t *)(local_100._8_8_ + uVar4))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017ba0f5;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017ba0f5:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(short *)(local_b0._0_8_ + uVar5 * 2) ==
                        *(short *)(local_100._8_8_ + uVar4 * 2))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case INT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bc439;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bc439:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(short *)(local_b0._0_8_ + uVar5 * 2) ==
                        *(short *)(local_100._8_8_ + uVar4 * 2))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bb935;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bb935:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(int *)(local_b0._0_8_ + uVar5 * 4) ==
                        *(int *)(local_100._8_8_ + uVar4 * 4))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case INT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bb3b9;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bb3b9:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(int *)(local_b0._0_8_ + uVar5 * 4) ==
                        *(int *)(local_100._8_8_ + uVar4 * 4))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b96f4;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b96f4:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(long *)(local_b0._0_8_ + uVar5 * 8) ==
                        *(long *)(local_100._8_8_ + uVar4 * 8))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case INT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bc320;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bc320:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(long *)(local_b0._0_8_ + uVar5 * 8) ==
                        *(long *)(local_100._8_8_ + uVar4 * 8))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        default:
switchD_017b720d_caseD_a:
          pNVar6 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_b8 = (undefined1  [8])(local_b0 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,"Unimplemented type for mark join!","");
          NotImplementedException::NotImplementedException(pNVar6,(string *)local_b8);
          __cxa_throw(pNVar6,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        case FLOAT:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b9803;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b9803:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (bVar12 = Equals::Operation<float>
                                           ((float *)(local_b0._0_8_ + uVar5 * 4),
                                            (float *)(local_100._8_8_ + uVar4 * 4)), bVar12)) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case DOUBLE:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b9b66;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b9b66:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (bVar12 = Equals::Operation<double>
                                           ((double *)(local_b0._0_8_ + uVar5 * 8),
                                            (double *)(local_100._8_8_ + uVar4 * 8)), bVar12)) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
        }
      }
      else if (PVar1 == VARCHAR) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          iVar7 = 0;
          do {
            if (found_match[iVar7] == false) {
              iVar3 = iVar7;
              if (*(long *)local_b8 != 0) {
                iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017bd7bc;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar3 & 0x3f) & *(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8))
                       != 0)) {
LAB_017bd7bc:
                uVar9 = 0;
                do {
                  uVar5 = uVar9;
                  if (*(long *)local_100._0_8_ != 0) {
                    uVar5 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar9 * 4);
                  }
                  if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                      ((*(ulong *)((long)local_f0[0].sel_vector + (uVar5 >> 6) * 8) >>
                        (uVar5 & 0x3f) & 1) != 0)) &&
                     (bVar12 = string_t::operator==
                                         ((string_t *)(local_b0._0_8_ + iVar3 * 0x10),
                                          (string_t *)(local_100._8_8_ + uVar5 * 0x10)), bVar12)) {
                    found_match[iVar7] = true;
                    break;
                  }
                  uVar9 = uVar9 + 1;
                } while (rcount + (rcount == 0) != uVar9);
              }
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != lcount);
        }
      }
      else if (PVar1 == UINT128) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          iVar7 = 0;
          do {
            if (found_match[iVar7] == false) {
              iVar3 = iVar7;
              if (*(long *)local_b8 != 0) {
                iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017bd314;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar3 & 0x3f) & *(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8))
                       != 0)) {
LAB_017bd314:
                uVar9 = 0;
                do {
                  uVar5 = uVar9;
                  if (*(long *)local_100._0_8_ != 0) {
                    uVar5 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar9 * 4);
                  }
                  if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                      ((*(ulong *)((long)local_f0[0].sel_vector + (uVar5 >> 6) * 8) >>
                        (uVar5 & 0x3f) & 1) != 0)) &&
                     (bVar12 = uhugeint_t::operator==
                                         ((uhugeint_t *)(local_b0._0_8_ + iVar3 * 0x10),
                                          (uhugeint_t *)(local_100._8_8_ + uVar5 * 0x10)), bVar12))
                  {
                    found_match[iVar7] = true;
                    break;
                  }
                  uVar9 = uVar9 + 1;
                } while (rcount + (rcount == 0) != uVar9);
              }
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != lcount);
        }
      }
      else {
        if (PVar1 != INT128) goto switchD_017b720d_caseD_a;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          uVar9 = 0;
          do {
            if (found_match[uVar9] == false) {
              uVar5 = uVar9;
              if (*(long *)local_b8 != 0) {
                uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017b829d;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8))
                       != 0)) {
LAB_017b829d:
                uVar10 = 0;
                do {
                  uVar4 = uVar10;
                  if (*(long *)local_100._0_8_ != 0) {
                    uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                  }
                  if (((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                         (uVar4 & 0x3f) & 1) != 0)) &&
                      (*(long *)(local_b0._0_8_ + uVar5 * 0x10) ==
                       *(long *)(local_100._8_8_ + uVar4 * 0x10))) &&
                     (((long *)(local_b0._0_8_ + uVar5 * 0x10))[1] ==
                      *(long *)(local_100._8_8_ + uVar4 * 0x10 + 8))) {
                    found_match[uVar9] = true;
                    break;
                  }
                  uVar10 = uVar10 + 1;
                } while (rcount + (rcount == 0) != uVar10);
              }
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != lcount);
        }
      }
      break;
    case COMPARE_NOTEQUAL:
      if (PVar1 < VARCHAR) {
        switch(PVar1) {
        case BOOL:
        case INT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b754d;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b754d:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(data_ptr_t)(local_b0._0_8_ + uVar5) !=
                        *(data_t *)(local_100._8_8_ + uVar4))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bad18;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bad18:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(data_ptr_t)(local_b0._0_8_ + uVar5) !=
                        *(data_t *)(local_100._8_8_ + uVar4))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b8f2b;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b8f2b:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(short *)(local_b0._0_8_ + uVar5 * 2) !=
                        *(short *)(local_100._8_8_ + uVar4 * 2))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case INT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017baf4a;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017baf4a:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(short *)(local_b0._0_8_ + uVar5 * 2) !=
                        *(short *)(local_100._8_8_ + uVar4 * 2))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017ba327;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017ba327:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(int *)(local_b0._0_8_ + uVar5 * 4) !=
                        *(int *)(local_100._8_8_ + uVar4 * 4))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case INT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017ba20f;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017ba20f:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(int *)(local_b0._0_8_ + uVar5 * 4) !=
                        *(int *)(local_100._8_8_ + uVar4 * 4))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b875b;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b875b:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(long *)(local_b0._0_8_ + uVar5 * 8) !=
                        *(long *)(local_100._8_8_ + uVar4 * 8))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case INT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bae31;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bae31:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(long *)(local_b0._0_8_ + uVar5 * 8) !=
                        *(long *)(local_100._8_8_ + uVar4 * 8))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        default:
switchD_017b748b_caseD_a:
          pNVar6 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_b8 = (undefined1  [8])(local_b0 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,"Unimplemented type for mark join!","");
          NotImplementedException::NotImplementedException(pNVar6,(string *)local_b8);
          __cxa_throw(pNVar6,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        case FLOAT:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b886a;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b886a:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (bVar12 = Equals::Operation<float>
                                           ((float *)(local_b0._0_8_ + uVar5 * 4),
                                            (float *)(local_100._8_8_ + uVar4 * 4)), !bVar12)) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case DOUBLE:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b8bc5;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b8bc5:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (bVar12 = Equals::Operation<double>
                                           ((double *)(local_b0._0_8_ + uVar5 * 8),
                                            (double *)(local_100._8_8_ + uVar4 * 8)), !bVar12)) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
        }
      }
      else if (PVar1 == VARCHAR) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          iVar7 = 0;
          do {
            if (found_match[iVar7] == false) {
              iVar3 = iVar7;
              if (*(long *)local_b8 != 0) {
                iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017bcf96;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar3 & 0x3f) & *(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8))
                       != 0)) {
LAB_017bcf96:
                uVar9 = 0;
                do {
                  uVar5 = uVar9;
                  if (*(long *)local_100._0_8_ != 0) {
                    uVar5 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar9 * 4);
                  }
                  if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                      ((*(ulong *)((long)local_f0[0].sel_vector + (uVar5 >> 6) * 8) >>
                        (uVar5 & 0x3f) & 1) != 0)) &&
                     (bVar12 = string_t::operator==
                                         ((string_t *)(local_b0._0_8_ + iVar3 * 0x10),
                                          (string_t *)(local_100._8_8_ + uVar5 * 0x10)), !bVar12)) {
                    found_match[iVar7] = true;
                    break;
                  }
                  uVar9 = uVar9 + 1;
                } while (rcount + (rcount == 0) != uVar9);
              }
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != lcount);
        }
      }
      else if (PVar1 == UINT128) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          iVar7 = 0;
          do {
            if (found_match[iVar7] == false) {
              iVar3 = iVar7;
              if (*(long *)local_b8 != 0) {
                iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017bcc18;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar3 & 0x3f) & *(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8))
                       != 0)) {
LAB_017bcc18:
                uVar9 = 0;
                do {
                  uVar5 = uVar9;
                  if (*(long *)local_100._0_8_ != 0) {
                    uVar5 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar9 * 4);
                  }
                  if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                      ((*(ulong *)((long)local_f0[0].sel_vector + (uVar5 >> 6) * 8) >>
                        (uVar5 & 0x3f) & 1) != 0)) &&
                     (bVar12 = uhugeint_t::operator==
                                         ((uhugeint_t *)(local_b0._0_8_ + iVar3 * 0x10),
                                          (uhugeint_t *)(local_100._8_8_ + uVar5 * 0x10)), !bVar12))
                  {
                    found_match[iVar7] = true;
                    break;
                  }
                  uVar9 = uVar9 + 1;
                } while (rcount + (rcount == 0) != uVar9);
              }
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != lcount);
        }
      }
      else {
        if (PVar1 != INT128) goto switchD_017b748b_caseD_a;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          uVar9 = 0;
          do {
            if (found_match[uVar9] == false) {
              uVar5 = uVar9;
              if (*(long *)local_b8 != 0) {
                uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017b7cfb;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8))
                       != 0)) {
LAB_017b7cfb:
                uVar10 = 0;
                do {
                  uVar4 = uVar10;
                  if (*(long *)local_100._0_8_ != 0) {
                    uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                  }
                  if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                      ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                        (uVar4 & 0x3f) & 1) != 0)) &&
                     ((*(long *)(local_b0._0_8_ + uVar5 * 0x10) !=
                       *(long *)(local_100._8_8_ + uVar4 * 0x10) ||
                      (((long *)(local_b0._0_8_ + uVar5 * 0x10))[1] !=
                       *(long *)(local_100._8_8_ + uVar4 * 0x10 + 8))))) {
                    found_match[uVar9] = true;
                    break;
                  }
                  uVar10 = uVar10 + 1;
                } while (rcount + (rcount == 0) != uVar10);
              }
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != lcount);
        }
      }
      break;
    case COMPARE_LESSTHAN:
      if (PVar1 < VARCHAR) {
        switch(PVar1) {
        case BOOL:
        case INT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b77cb;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b77cb:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       ((char)*(data_ptr_t)(local_b0._0_8_ + uVar5) <
                        (char)*(data_ptr_t)(local_100._8_8_ + uVar4))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bbb6f;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bbb6f:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(byte *)(local_b0._0_8_ + uVar5) < *(byte *)(local_100._8_8_ + uVar4))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b9c91;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b9c91:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(ushort *)(local_b0._0_8_ + uVar5 * 2) <
                        *(ushort *)(local_100._8_8_ + uVar4 * 2))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case INT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bbda1;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bbda1:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(short *)(local_b0._0_8_ + uVar5 * 2) <
                        *(short *)(local_100._8_8_ + uVar4 * 2))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bb064;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bb064:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(uint *)(local_b0._0_8_ + uVar5 * 4) <
                        *(uint *)(local_100._8_8_ + uVar4 * 4))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case INT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bac00;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bac00:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(int *)(local_b0._0_8_ + uVar5 * 4) < *(int *)(local_100._8_8_ + uVar4 * 4)
                       )) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b9166;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b9166:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(ulong *)(local_b0._0_8_ + uVar5 * 8) <
                        *(ulong *)(local_100._8_8_ + uVar4 * 8))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case INT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bbc88;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bbc88:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(long *)(local_b0._0_8_ + uVar5 * 8) <
                        *(long *)(local_100._8_8_ + uVar4 * 8))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        default:
switchD_017b7709_caseD_a:
          pNVar6 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_b8 = (undefined1  [8])(local_b0 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,"Unimplemented type for mark join!","");
          NotImplementedException::NotImplementedException(pNVar6,(string *)local_b8);
          __cxa_throw(pNVar6,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        case FLOAT:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b9275;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b9275:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (bVar12 = GreaterThan::Operation<float>
                                           ((float *)(local_100._8_8_ + uVar4 * 4),
                                            (float *)(local_b0._0_8_ + uVar5 * 4)), bVar12)) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case DOUBLE:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b9924;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b9924:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (bVar12 = GreaterThan::Operation<double>
                                           ((double *)(local_100._8_8_ + uVar4 * 8),
                                            (double *)(local_b0._0_8_ + uVar5 * 8)), bVar12)) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
        }
      }
      else if (PVar1 == VARCHAR) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          iVar7 = 0;
          do {
            if (found_match[iVar7] == false) {
              iVar3 = iVar7;
              if (*(long *)local_b8 != 0) {
                iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017bd568;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar3 & 0x3f) & *(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8))
                       != 0)) {
LAB_017bd568:
                uVar9 = 0;
                do {
                  uVar5 = uVar9;
                  if (*(long *)local_100._0_8_ != 0) {
                    uVar5 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar9 * 4);
                  }
                  if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                      ((*(ulong *)((long)local_f0[0].sel_vector + (uVar5 >> 6) * 8) >>
                        (uVar5 & 0x3f) & 1) != 0)) &&
                     (bVar12 = string_t::StringComparisonOperators::GreaterThan
                                         ((string_t *)(local_100._8_8_ + uVar5 * 0x10),
                                          (string_t *)(local_b0._0_8_ + iVar3 * 0x10)), bVar12)) {
                    found_match[iVar7] = true;
                    break;
                  }
                  uVar9 = uVar9 + 1;
                } while (rcount + (rcount == 0) != uVar9);
              }
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != lcount);
        }
      }
      else if (PVar1 == UINT128) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          iVar7 = 0;
          do {
            if (found_match[iVar7] == false) {
              iVar3 = iVar7;
              if (*(long *)local_b8 != 0) {
                iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017bd0c0;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar3 & 0x3f) & *(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8))
                       != 0)) {
LAB_017bd0c0:
                uVar9 = 0;
                do {
                  uVar5 = uVar9;
                  if (*(long *)local_100._0_8_ != 0) {
                    uVar5 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar9 * 4);
                  }
                  if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                      ((*(ulong *)((long)local_f0[0].sel_vector + (uVar5 >> 6) * 8) >>
                        (uVar5 & 0x3f) & 1) != 0)) &&
                     (bVar12 = uhugeint_t::operator>
                                         ((uhugeint_t *)(local_100._8_8_ + uVar5 * 0x10),
                                          (uhugeint_t *)(local_b0._0_8_ + iVar3 * 0x10)), bVar12)) {
                    found_match[iVar7] = true;
                    break;
                  }
                  uVar9 = uVar9 + 1;
                } while (rcount + (rcount == 0) != uVar9);
              }
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != lcount);
        }
      }
      else {
        if (PVar1 != INT128) goto switchD_017b7709_caseD_a;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          local_50 = (data_ptr_t)local_b0._0_8_;
          uVar9 = 0;
          do {
            if (found_match[uVar9] == false) {
              uVar5 = uVar9;
              if (*(long *)local_b8 != 0) {
                uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017b7fc7;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8))
                       != 0)) {
LAB_017b7fc7:
                uVar10 = 0;
                do {
                  uVar4 = uVar10;
                  if (*(long *)local_100._0_8_ != 0) {
                    uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                  }
                  if (((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f)
                      & 1) != 0)) {
                    uVar2 = ((ulong *)(local_b0._0_8_ + uVar5 * 0x10))[1];
                    if (((long)uVar2 < (long)*(ulong *)(local_100._8_8_ + uVar4 * 0x10 + 8)) ||
                       (*(ulong *)(local_b0._0_8_ + uVar5 * 0x10) <
                        *(ulong *)(local_100._8_8_ + uVar4 * 0x10) &&
                        *(ulong *)(local_100._8_8_ + uVar4 * 0x10 + 8) == uVar2)) {
                      found_match[uVar9] = true;
                      break;
                    }
                  }
                  uVar10 = uVar10 + 1;
                } while (rcount + (rcount == 0) != uVar10);
              }
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != lcount);
        }
      }
      break;
    case COMPARE_GREATERTHAN:
      if (PVar1 < VARCHAR) {
        switch(PVar1) {
        case BOOL:
        case INT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b790a;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b790a:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       ((char)*(data_ptr_t)(local_100._8_8_ + uVar4) <
                        (char)*(data_ptr_t)(local_b0._0_8_ + uVar5))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bbebb;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bbebb:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(byte *)(local_100._8_8_ + uVar4) < *(byte *)(local_b0._0_8_ + uVar5))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b9ec3;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b9ec3:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(ushort *)(local_100._8_8_ + uVar4 * 2) <
                        *(ushort *)(local_b0._0_8_ + uVar5 * 2))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case INT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bc0ed;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bc0ed:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(short *)(local_100._8_8_ + uVar4 * 2) <
                        *(short *)(local_b0._0_8_ + uVar5 * 2))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bb4d1;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bb4d1:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(uint *)(local_100._8_8_ + uVar4 * 4) <
                        *(uint *)(local_b0._0_8_ + uVar5 * 4))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case INT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bb17c;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bb17c:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(int *)(local_100._8_8_ + uVar4 * 4) < *(int *)(local_b0._0_8_ + uVar5 * 4)
                       )) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b94ba;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b94ba:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(ulong *)(local_100._8_8_ + uVar4 * 8) <
                        *(ulong *)(local_b0._0_8_ + uVar5 * 8))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case INT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bbfd4;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bbfd4:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(long *)(local_100._8_8_ + uVar4 * 8) <
                        *(long *)(local_b0._0_8_ + uVar5 * 8))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        default:
switchD_017b7848_caseD_a:
          pNVar6 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_b8 = (undefined1  [8])(local_b0 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,"Unimplemented type for mark join!","");
          NotImplementedException::NotImplementedException(pNVar6,(string *)local_b8);
          __cxa_throw(pNVar6,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        case FLOAT:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b95c9;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b95c9:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (bVar12 = GreaterThan::Operation<float>
                                           ((float *)(local_b0._0_8_ + uVar5 * 4),
                                            (float *)(local_100._8_8_ + uVar4 * 4)), bVar12)) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case DOUBLE:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b9a45;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b9a45:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (bVar12 = GreaterThan::Operation<double>
                                           ((double *)(local_b0._0_8_ + uVar5 * 8),
                                            (double *)(local_100._8_8_ + uVar4 * 8)), bVar12)) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
        }
      }
      else if (PVar1 == VARCHAR) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          iVar7 = 0;
          do {
            if (found_match[iVar7] == false) {
              iVar3 = iVar7;
              if (*(long *)local_b8 != 0) {
                iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017bd692;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar3 & 0x3f) & *(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8))
                       != 0)) {
LAB_017bd692:
                uVar9 = 0;
                do {
                  uVar5 = uVar9;
                  if (*(long *)local_100._0_8_ != 0) {
                    uVar5 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar9 * 4);
                  }
                  if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                      ((*(ulong *)((long)local_f0[0].sel_vector + (uVar5 >> 6) * 8) >>
                        (uVar5 & 0x3f) & 1) != 0)) &&
                     (bVar12 = string_t::StringComparisonOperators::GreaterThan
                                         ((string_t *)(local_b0._0_8_ + iVar3 * 0x10),
                                          (string_t *)(local_100._8_8_ + uVar5 * 0x10)), bVar12)) {
                    found_match[iVar7] = true;
                    break;
                  }
                  uVar9 = uVar9 + 1;
                } while (rcount + (rcount == 0) != uVar9);
              }
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != lcount);
        }
      }
      else if (PVar1 == UINT128) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          iVar7 = 0;
          do {
            if (found_match[iVar7] == false) {
              iVar3 = iVar7;
              if (*(long *)local_b8 != 0) {
                iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017bd1ea;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar3 & 0x3f) & *(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8))
                       != 0)) {
LAB_017bd1ea:
                uVar9 = 0;
                do {
                  uVar5 = uVar9;
                  if (*(long *)local_100._0_8_ != 0) {
                    uVar5 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar9 * 4);
                  }
                  if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                      ((*(ulong *)((long)local_f0[0].sel_vector + (uVar5 >> 6) * 8) >>
                        (uVar5 & 0x3f) & 1) != 0)) &&
                     (bVar12 = uhugeint_t::operator>
                                         ((uhugeint_t *)(local_b0._0_8_ + iVar3 * 0x10),
                                          (uhugeint_t *)(local_100._8_8_ + uVar5 * 0x10)), bVar12))
                  {
                    found_match[iVar7] = true;
                    break;
                  }
                  uVar9 = uVar9 + 1;
                } while (rcount + (rcount == 0) != uVar9);
              }
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != lcount);
        }
      }
      else {
        if (PVar1 != INT128) goto switchD_017b7848_caseD_a;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          local_50 = (data_ptr_t)local_b0._0_8_;
          uVar9 = 0;
          do {
            if (found_match[uVar9] == false) {
              uVar5 = uVar9;
              if (*(long *)local_b8 != 0) {
                uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017b8138;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8))
                       != 0)) {
LAB_017b8138:
                uVar10 = 0;
                do {
                  uVar4 = uVar10;
                  if (*(long *)local_100._0_8_ != 0) {
                    uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                  }
                  if (((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f)
                      & 1) != 0)) {
                    uVar2 = ((ulong *)(local_b0._0_8_ + uVar5 * 0x10))[1];
                    if (((long)*(ulong *)(local_100._8_8_ + uVar4 * 0x10 + 8) < (long)uVar2) ||
                       (*(ulong *)(local_100._8_8_ + uVar4 * 0x10) <
                        *(ulong *)(local_b0._0_8_ + uVar5 * 0x10) &&
                        uVar2 == *(ulong *)(local_100._8_8_ + uVar4 * 0x10 + 8))) {
                      found_match[uVar9] = true;
                      break;
                    }
                  }
                  uVar10 = uVar10 + 1;
                } while (rcount + (rcount == 0) != uVar10);
              }
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != lcount);
        }
      }
      break;
    case COMPARE_LESSTHANOREQUALTO:
      if (PVar1 < VARCHAR) {
        switch(PVar1) {
        case BOOL:
        case INT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b740e;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b740e:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       ((char)*(data_ptr_t)(local_b0._0_8_ + uVar5) <=
                        (char)*(data_ptr_t)(local_100._8_8_ + uVar4))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017ba66f;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017ba66f:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(byte *)(local_b0._0_8_ + uVar5) <= *(byte *)(local_100._8_8_ + uVar4))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b8e11;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b8e11:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(ushort *)(local_b0._0_8_ + uVar5 * 2) <=
                        *(ushort *)(local_100._8_8_ + uVar4 * 2))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case INT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017ba9c1;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017ba9c1:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(short *)(local_b0._0_8_ + uVar5 * 2) <=
                        *(short *)(local_100._8_8_ + uVar4 * 2))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b9fdd;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b9fdd:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(uint *)(local_b0._0_8_ + uVar5 * 4) <=
                        *(uint *)(local_100._8_8_ + uVar4 * 4))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case INT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b9dab;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b9dab:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(int *)(local_b0._0_8_ + uVar5 * 4) <=
                        *(int *)(local_100._8_8_ + uVar4 * 4))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b8521;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b8521:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(ulong *)(local_b0._0_8_ + uVar5 * 8) <=
                        *(ulong *)(local_100._8_8_ + uVar4 * 8))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case INT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017ba8a8;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017ba8a8:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(long *)(local_b0._0_8_ + uVar5 * 8) <=
                        *(long *)(local_100._8_8_ + uVar4 * 8))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        default:
switchD_017b734c_caseD_a:
          pNVar6 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_b8 = (undefined1  [8])(local_b0 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,"Unimplemented type for mark join!","");
          NotImplementedException::NotImplementedException(pNVar6,(string *)local_b8);
          __cxa_throw(pNVar6,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        case FLOAT:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b8630;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b8630:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (bVar12 = GreaterThan::Operation<float>
                                           ((float *)(local_b0._0_8_ + uVar5 * 4),
                                            (float *)(local_100._8_8_ + uVar4 * 4)), !bVar12)) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case DOUBLE:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b898b;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b898b:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (bVar12 = GreaterThan::Operation<double>
                                           ((double *)(local_b0._0_8_ + uVar5 * 8),
                                            (double *)(local_100._8_8_ + uVar4 * 8)), !bVar12)) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
        }
      }
      else if (PVar1 == VARCHAR) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          iVar7 = 0;
          do {
            if (found_match[iVar7] == false) {
              iVar3 = iVar7;
              if (*(long *)local_b8 != 0) {
                iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017bce6c;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar3 & 0x3f) & *(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8))
                       != 0)) {
LAB_017bce6c:
                uVar9 = 0;
                do {
                  uVar5 = uVar9;
                  if (*(long *)local_100._0_8_ != 0) {
                    uVar5 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar9 * 4);
                  }
                  if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                      ((*(ulong *)((long)local_f0[0].sel_vector + (uVar5 >> 6) * 8) >>
                        (uVar5 & 0x3f) & 1) != 0)) &&
                     (bVar12 = string_t::StringComparisonOperators::GreaterThan
                                         ((string_t *)(local_b0._0_8_ + iVar3 * 0x10),
                                          (string_t *)(local_100._8_8_ + uVar5 * 0x10)), !bVar12)) {
                    found_match[iVar7] = true;
                    break;
                  }
                  uVar9 = uVar9 + 1;
                } while (rcount + (rcount == 0) != uVar9);
              }
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != lcount);
        }
      }
      else if (PVar1 == UINT128) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          iVar7 = 0;
          do {
            if (found_match[iVar7] == false) {
              iVar3 = iVar7;
              if (*(long *)local_b8 != 0) {
                iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017bcaee;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar3 & 0x3f) & *(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8))
                       != 0)) {
LAB_017bcaee:
                uVar9 = 0;
                do {
                  uVar5 = uVar9;
                  if (*(long *)local_100._0_8_ != 0) {
                    uVar5 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar9 * 4);
                  }
                  if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                      ((*(ulong *)((long)local_f0[0].sel_vector + (uVar5 >> 6) * 8) >>
                        (uVar5 & 0x3f) & 1) != 0)) &&
                     (bVar12 = uhugeint_t::operator>
                                         ((uhugeint_t *)(local_b0._0_8_ + iVar3 * 0x10),
                                          (uhugeint_t *)(local_100._8_8_ + uVar5 * 0x10)), !bVar12))
                  {
                    found_match[iVar7] = true;
                    break;
                  }
                  uVar9 = uVar9 + 1;
                } while (rcount + (rcount == 0) != uVar9);
              }
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != lcount);
        }
      }
      else {
        if (PVar1 != INT128) goto switchD_017b734c_caseD_a;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          local_50 = (data_ptr_t)local_b0._0_8_;
          uVar9 = 0;
          do {
            if (found_match[uVar9] == false) {
              uVar5 = uVar9;
              if (*(long *)local_b8 != 0) {
                uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017b7b96;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8))
                       != 0)) {
LAB_017b7b96:
                uVar10 = 0;
                do {
                  uVar4 = uVar10;
                  if (*(long *)local_100._0_8_ != 0) {
                    uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                  }
                  if (((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f)
                      & 1) != 0)) {
                    uVar2 = ((ulong *)(local_b0._0_8_ + uVar5 * 0x10))[1];
                    if (((long)uVar2 <= (long)*(ulong *)(local_100._8_8_ + uVar4 * 0x10 + 8)) &&
                       (*(ulong *)(local_b0._0_8_ + uVar5 * 0x10) <=
                        *(ulong *)(local_100._8_8_ + uVar4 * 0x10) ||
                        uVar2 != *(ulong *)(local_100._8_8_ + uVar4 * 0x10 + 8))) {
                      found_match[uVar9] = true;
                      break;
                    }
                  }
                  uVar10 = uVar10 + 1;
                } while (rcount + (rcount == 0) != uVar10);
              }
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != lcount);
        }
      }
      break;
    case COMPARE_GREATERTHANOREQUALTO:
      if (PVar1 < VARCHAR) {
        switch(PVar1) {
        case BOOL:
        case INT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b768c;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b768c:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       ((char)*(data_ptr_t)(local_100._8_8_ + uVar4) <=
                        (char)*(data_ptr_t)(local_b0._0_8_ + uVar5))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bb5e9;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bb5e9:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(byte *)(local_100._8_8_ + uVar4) <= *(byte *)(local_b0._0_8_ + uVar5))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b93a0;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b93a0:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(ushort *)(local_100._8_8_ + uVar4 * 2) <=
                        *(ushort *)(local_b0._0_8_ + uVar5 * 2))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case INT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bb81b;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bb81b:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(short *)(local_100._8_8_ + uVar4 * 2) <=
                        *(short *)(local_b0._0_8_ + uVar5 * 2))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017ba557;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017ba557:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(uint *)(local_100._8_8_ + uVar4 * 4) <=
                        *(uint *)(local_b0._0_8_ + uVar5 * 4))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case INT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017ba43f;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017ba43f:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(int *)(local_100._8_8_ + uVar4 * 4) <=
                        *(int *)(local_b0._0_8_ + uVar5 * 4))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case UINT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b8ab6;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b8ab6:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(ulong *)(local_100._8_8_ + uVar4 * 8) <=
                        *(ulong *)(local_b0._0_8_ + uVar5 * 8))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case INT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017bb702;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017bb702:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (*(long *)(local_100._8_8_ + uVar4 * 8) <=
                        *(long *)(local_b0._0_8_ + uVar5 * 8))) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        default:
switchD_017b75ca_caseD_a:
          pNVar6 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_b8 = (undefined1  [8])(local_b0 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,"Unimplemented type for mark join!","");
          NotImplementedException::NotImplementedException(pNVar6,(string *)local_b8);
          __cxa_throw(pNVar6,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        case FLOAT:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b8ce6;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b8ce6:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (bVar12 = GreaterThanEquals::Operation<float>
                                           ((float *)(local_b0._0_8_ + uVar5 * 4),
                                            (float *)(local_100._8_8_ + uVar4 * 4)), bVar12)) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case DOUBLE:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017b903b;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8)
                         ) != 0)) {
LAB_017b903b:
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                        ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                          (uVar4 & 0x3f) & 1) != 0)) &&
                       (bVar12 = GreaterThanEquals::Operation<double>
                                           ((double *)(local_b0._0_8_ + uVar5 * 8),
                                            (double *)(local_100._8_8_ + uVar4 * 8)), bVar12)) {
                      found_match[uVar9] = true;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount + (rcount == 0) != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
        }
      }
      else if (PVar1 == VARCHAR) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          iVar7 = 0;
          do {
            if (found_match[iVar7] == false) {
              iVar3 = iVar7;
              if (*(long *)local_b8 != 0) {
                iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017bd43e;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar3 & 0x3f) & *(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8))
                       != 0)) {
LAB_017bd43e:
                uVar9 = 0;
                do {
                  uVar5 = uVar9;
                  if (*(long *)local_100._0_8_ != 0) {
                    uVar5 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar9 * 4);
                  }
                  if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                      ((*(ulong *)((long)local_f0[0].sel_vector + (uVar5 >> 6) * 8) >>
                        (uVar5 & 0x3f) & 1) != 0)) &&
                     (bVar12 = string_t::StringComparisonOperators::GreaterThan
                                         ((string_t *)(local_100._8_8_ + uVar5 * 0x10),
                                          (string_t *)(local_b0._0_8_ + iVar3 * 0x10)), !bVar12)) {
                    found_match[iVar7] = true;
                    break;
                  }
                  uVar9 = uVar9 + 1;
                } while (rcount + (rcount == 0) != uVar9);
              }
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != lcount);
        }
      }
      else if (PVar1 == UINT128) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          iVar7 = 0;
          do {
            if (found_match[iVar7] == false) {
              iVar3 = iVar7;
              if (*(long *)local_b8 != 0) {
                iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017bcd42;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar3 & 0x3f) & *(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8))
                       != 0)) {
LAB_017bcd42:
                uVar9 = 0;
                do {
                  uVar5 = uVar9;
                  if (*(long *)local_100._0_8_ != 0) {
                    uVar5 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar9 * 4);
                  }
                  if ((((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                      ((*(ulong *)((long)local_f0[0].sel_vector + (uVar5 >> 6) * 8) >>
                        (uVar5 & 0x3f) & 1) != 0)) &&
                     (bVar12 = uhugeint_t::operator>
                                         ((uhugeint_t *)(local_100._8_8_ + uVar5 * 0x10),
                                          (uhugeint_t *)(local_b0._0_8_ + iVar3 * 0x10)), !bVar12))
                  {
                    found_match[iVar7] = true;
                    break;
                  }
                  uVar9 = uVar9 + 1;
                } while (rcount + (rcount == 0) != uVar9);
              }
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != lcount);
        }
      }
      else {
        if (PVar1 != INT128) goto switchD_017b75ca_caseD_a;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          local_50 = (data_ptr_t)local_b0._0_8_;
          uVar9 = 0;
          do {
            if (found_match[uVar9] == false) {
              uVar5 = uVar9;
              if (*(long *)local_b8 != 0) {
                uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017b7e56;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)uVar5 & 0x3f) & *(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8))
                       != 0)) {
LAB_017b7e56:
                uVar10 = 0;
                do {
                  uVar4 = uVar10;
                  if (*(long *)local_100._0_8_ != 0) {
                    uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                  }
                  if (((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f)
                      & 1) != 0)) {
                    uVar2 = ((ulong *)(local_b0._0_8_ + uVar5 * 0x10))[1];
                    if (((long)*(ulong *)(local_100._8_8_ + uVar4 * 0x10 + 8) <= (long)uVar2) &&
                       (*(ulong *)(local_100._8_8_ + uVar4 * 0x10) <=
                        *(ulong *)(local_b0._0_8_ + uVar5 * 0x10) ||
                        *(ulong *)(local_100._8_8_ + uVar4 * 0x10 + 8) != uVar2)) {
                      found_match[uVar9] = true;
                      break;
                    }
                  }
                  uVar10 = uVar10 + 1;
                } while (rcount + (rcount == 0) != uVar10);
              }
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != lcount);
        }
      }
      break;
    default:
      pNVar6 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_b8 = (undefined1  [8])(local_b0 + 8);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"Unimplemented comparison type for join!","");
      NotImplementedException::NotImplementedException(pNVar6,(string *)local_b8);
      __cxa_throw(pNVar6,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    case COMPARE_DISTINCT_FROM:
      if (PVar1 < VARCHAR) {
        switch(PVar1) {
        case BOOL:
        case INT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            iVar7 = 0;
            do {
              if (found_match[iVar7] == false) {
                iVar3 = iVar7;
                if (*(long *)local_b8 != 0) {
                  iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  bVar12 = false;
                }
                else {
                  bVar12 = (*(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8) >> (iVar3 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  iVar11 = 0;
                  do {
                    iVar8 = iVar11;
                    if (*(long *)local_100._0_8_ != 0) {
                      iVar8 = (idx_t)*(uint *)(*(long *)local_100._0_8_ + iVar11 * 4);
                    }
                    if ((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) {
                      bVar13 = false;
                    }
                    else {
                      bVar13 = (*(ulong *)((long)local_f0[0].sel_vector + (iVar8 >> 6) * 8) >>
                                (iVar8 & 0x3f) & 1) == 0;
                    }
                    if ((bVar12 | bVar13) == 1) {
                      if (bVar12 != bVar13) {
LAB_017b7a8c:
                        found_match[iVar7] = true;
                        break;
                      }
                    }
                    else if (*(data_ptr_t)(local_b0._0_8_ + iVar3) !=
                             *(data_t *)(local_100._8_8_ + iVar8)) goto LAB_017b7a8c;
                    iVar11 = iVar11 + 1;
                  } while (rcount != iVar11);
                }
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 != lcount);
          }
          break;
        case UINT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            iVar7 = 0;
            do {
              if (found_match[iVar7] == false) {
                iVar3 = iVar7;
                if (*(long *)local_b8 != 0) {
                  iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  bVar12 = false;
                }
                else {
                  bVar12 = (*(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8) >> (iVar3 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  iVar11 = 0;
                  do {
                    iVar8 = iVar11;
                    if (*(long *)local_100._0_8_ != 0) {
                      iVar8 = (idx_t)*(uint *)(*(long *)local_100._0_8_ + iVar11 * 4);
                    }
                    if ((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) {
                      bVar13 = false;
                    }
                    else {
                      bVar13 = (*(ulong *)((long)local_f0[0].sel_vector + (iVar8 >> 6) * 8) >>
                                (iVar8 & 0x3f) & 1) == 0;
                    }
                    if ((bVar12 | bVar13) == 1) {
                      if (bVar12 != bVar13) {
LAB_017bc7d6:
                        found_match[iVar7] = true;
                        break;
                      }
                    }
                    else if (*(data_ptr_t)(local_b0._0_8_ + iVar3) !=
                             *(data_t *)(local_100._8_8_ + iVar8)) goto LAB_017bc7d6;
                    iVar11 = iVar11 + 1;
                  } while (rcount != iVar11);
                }
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 != lcount);
          }
          break;
        case UINT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            iVar7 = 0;
            do {
              if (found_match[iVar7] == false) {
                iVar3 = iVar7;
                if (*(long *)local_b8 != 0) {
                  iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  bVar12 = false;
                }
                else {
                  bVar12 = (*(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8) >> (iVar3 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  iVar11 = 0;
                  do {
                    iVar8 = iVar11;
                    if (*(long *)local_100._0_8_ != 0) {
                      iVar8 = (idx_t)*(uint *)(*(long *)local_100._0_8_ + iVar11 * 4);
                    }
                    if ((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) {
                      bVar13 = false;
                    }
                    else {
                      bVar13 = (*(ulong *)((long)local_f0[0].sel_vector + (iVar8 >> 6) * 8) >>
                                (iVar8 & 0x3f) & 1) == 0;
                    }
                    if ((bVar12 | bVar13) == 1) {
                      if (bVar12 != bVar13) {
LAB_017bba92:
                        found_match[iVar7] = true;
                        break;
                      }
                    }
                    else if (*(short *)(local_b0._0_8_ + iVar3 * 2) !=
                             *(short *)(local_100._8_8_ + iVar8 * 2)) goto LAB_017bba92;
                    iVar11 = iVar11 + 1;
                  } while (rcount != iVar11);
                }
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 != lcount);
          }
          break;
        case INT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            iVar7 = 0;
            do {
              if (found_match[iVar7] == false) {
                iVar3 = iVar7;
                if (*(long *)local_b8 != 0) {
                  iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  bVar12 = false;
                }
                else {
                  bVar12 = (*(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8) >> (iVar3 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  iVar11 = 0;
                  do {
                    iVar8 = iVar11;
                    if (*(long *)local_100._0_8_ != 0) {
                      iVar8 = (idx_t)*(uint *)(*(long *)local_100._0_8_ + iVar11 * 4);
                    }
                    if ((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) {
                      bVar13 = false;
                    }
                    else {
                      bVar13 = (*(ulong *)((long)local_f0[0].sel_vector + (iVar8 >> 6) * 8) >>
                                (iVar8 & 0x3f) & 1) == 0;
                    }
                    if ((bVar12 | bVar13) == 1) {
                      if (bVar12 != bVar13) {
LAB_017bca18:
                        found_match[iVar7] = true;
                        break;
                      }
                    }
                    else if (*(short *)(local_b0._0_8_ + iVar3 * 2) !=
                             *(short *)(local_100._8_8_ + iVar8 * 2)) goto LAB_017bca18;
                    iVar11 = iVar11 + 1;
                  } while (rcount != iVar11);
                }
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 != lcount);
          }
          break;
        case UINT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            iVar7 = 0;
            do {
              if (found_match[iVar7] == false) {
                iVar3 = iVar7;
                if (*(long *)local_b8 != 0) {
                  iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  bVar12 = false;
                }
                else {
                  bVar12 = (*(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8) >> (iVar3 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  iVar11 = 0;
                  do {
                    iVar8 = iVar11;
                    if (*(long *)local_100._0_8_ != 0) {
                      iVar8 = (idx_t)*(uint *)(*(long *)local_100._0_8_ + iVar11 * 4);
                    }
                    if ((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) {
                      bVar13 = false;
                    }
                    else {
                      bVar13 = (*(ulong *)((long)local_f0[0].sel_vector + (iVar8 >> 6) * 8) >>
                                (iVar8 & 0x3f) & 1) == 0;
                    }
                    if ((bVar12 | bVar13) == 1) {
                      if (bVar12 != bVar13) {
LAB_017bc6b6:
                        found_match[iVar7] = true;
                        break;
                      }
                    }
                    else if (*(int *)(local_b0._0_8_ + iVar3 * 4) !=
                             *(int *)(local_100._8_8_ + iVar8 * 4)) goto LAB_017bc6b6;
                    iVar11 = iVar11 + 1;
                  } while (rcount != iVar11);
                }
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 != lcount);
          }
          break;
        case INT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            iVar7 = 0;
            do {
              if (found_match[iVar7] == false) {
                iVar3 = iVar7;
                if (*(long *)local_b8 != 0) {
                  iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  bVar12 = false;
                }
                else {
                  bVar12 = (*(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8) >> (iVar3 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  iVar11 = 0;
                  do {
                    iVar8 = iVar11;
                    if (*(long *)local_100._0_8_ != 0) {
                      iVar8 = (idx_t)*(uint *)(*(long *)local_100._0_8_ + iVar11 * 4);
                    }
                    if ((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) {
                      bVar13 = false;
                    }
                    else {
                      bVar13 = (*(ulong *)((long)local_f0[0].sel_vector + (iVar8 >> 6) * 8) >>
                                (iVar8 & 0x3f) & 1) == 0;
                    }
                    if ((bVar12 | bVar13) == 1) {
                      if (bVar12 != bVar13) {
LAB_017bc596:
                        found_match[iVar7] = true;
                        break;
                      }
                    }
                    else if (*(int *)(local_b0._0_8_ + iVar3 * 4) !=
                             *(int *)(local_100._8_8_ + iVar8 * 4)) goto LAB_017bc596;
                    iVar11 = iVar11 + 1;
                  } while (rcount != iVar11);
                }
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 != lcount);
          }
          break;
        case UINT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            iVar7 = 0;
            do {
              if (found_match[iVar7] == false) {
                iVar3 = iVar7;
                if (*(long *)local_b8 != 0) {
                  iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  bVar12 = false;
                }
                else {
                  bVar12 = (*(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8) >> (iVar3 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  iVar11 = 0;
                  do {
                    iVar8 = iVar11;
                    if (*(long *)local_100._0_8_ != 0) {
                      iVar8 = (idx_t)*(uint *)(*(long *)local_100._0_8_ + iVar11 * 4);
                    }
                    if ((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) {
                      bVar13 = false;
                    }
                    else {
                      bVar13 = (*(ulong *)((long)local_f0[0].sel_vector + (iVar8 >> 6) * 8) >>
                                (iVar8 & 0x3f) & 1) == 0;
                    }
                    if ((bVar12 | bVar13) == 1) {
                      if (bVar12 != bVar13) {
LAB_017ba7cb:
                        found_match[iVar7] = true;
                        break;
                      }
                    }
                    else if (*(long *)(local_b0._0_8_ + iVar3 * 8) !=
                             *(long *)(local_100._8_8_ + iVar8 * 8)) goto LAB_017ba7cb;
                    iVar11 = iVar11 + 1;
                  } while (rcount != iVar11);
                }
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 != lcount);
          }
          break;
        case INT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            iVar7 = 0;
            do {
              if (found_match[iVar7] == false) {
                iVar3 = iVar7;
                if (*(long *)local_b8 != 0) {
                  iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  bVar12 = false;
                }
                else {
                  bVar12 = (*(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8) >> (iVar3 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  iVar11 = 0;
                  do {
                    iVar8 = iVar11;
                    if (*(long *)local_100._0_8_ != 0) {
                      iVar8 = (idx_t)*(uint *)(*(long *)local_100._0_8_ + iVar11 * 4);
                    }
                    if ((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) {
                      bVar13 = false;
                    }
                    else {
                      bVar13 = (*(ulong *)((long)local_f0[0].sel_vector + (iVar8 >> 6) * 8) >>
                                (iVar8 & 0x3f) & 1) == 0;
                    }
                    if ((bVar12 | bVar13) == 1) {
                      if (bVar12 != bVar13) {
LAB_017bc8f6:
                        found_match[iVar7] = true;
                        break;
                      }
                    }
                    else if (*(long *)(local_b0._0_8_ + iVar3 * 8) !=
                             *(long *)(local_100._8_8_ + iVar8 * 8)) goto LAB_017bc8f6;
                    iVar11 = iVar11 + 1;
                  } while (rcount != iVar11);
                }
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 != lcount);
          }
          break;
        default:
switchD_017b7987_caseD_a:
          pNVar6 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_b8 = (undefined1  [8])(local_b0 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,"Unimplemented type for mark join!","");
          NotImplementedException::NotImplementedException(pNVar6,(string *)local_b8);
          __cxa_throw(pNVar6,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        case FLOAT:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  bVar12 = false;
                }
                else {
                  bVar12 = (*(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8) >> (uVar5 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) {
                      bVar13 = false;
                    }
                    else {
                      bVar13 = (*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                                (uVar4 & 0x3f) & 1) == 0;
                    }
                    if ((bVar12 | bVar13) == 1) {
                      if (bVar12 != bVar13) {
LAB_017bab23:
                        found_match[uVar9] = true;
                        break;
                      }
                    }
                    else {
                      bVar13 = Equals::Operation<float>
                                         ((float *)(local_b0._0_8_ + uVar5 * 4),
                                          (float *)(local_100._8_8_ + uVar4 * 4));
                      if (!bVar13) goto LAB_017bab23;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
          break;
        case DOUBLE:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
          if (lcount != 0) {
            uVar9 = 0;
            do {
              if (found_match[uVar9] == false) {
                uVar5 = uVar9;
                if (*(long *)local_b8 != 0) {
                  uVar5 = (ulong)*(uint *)(*(long *)local_b8 + uVar9 * 4);
                }
                if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                  bVar12 = false;
                }
                else {
                  bVar12 = (*(ulong *)(local_b0._8_8_ + (uVar5 >> 6) * 8) >> (uVar5 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  uVar10 = 0;
                  do {
                    uVar4 = uVar10;
                    if (*(long *)local_100._0_8_ != 0) {
                      uVar4 = (ulong)*(uint *)(*(long *)local_100._0_8_ + uVar10 * 4);
                    }
                    if ((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) {
                      bVar13 = false;
                    }
                    else {
                      bVar13 = (*(ulong *)((long)local_f0[0].sel_vector + (uVar4 >> 6) * 8) >>
                                (uVar4 & 0x3f) & 1) == 0;
                    }
                    if ((bVar12 | bVar13) == 1) {
                      if (bVar12 != bVar13) {
LAB_017bb2dc:
                        found_match[uVar9] = true;
                        break;
                      }
                    }
                    else {
                      bVar13 = Equals::Operation<double>
                                         ((double *)(local_b0._0_8_ + uVar5 * 8),
                                          (double *)(local_100._8_8_ + uVar4 * 8));
                      if (!bVar13) goto LAB_017bb2dc;
                    }
                    uVar10 = uVar10 + 1;
                  } while (rcount != uVar10);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != lcount);
          }
        }
      }
      else if (PVar1 == VARCHAR) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          iVar7 = 0;
          do {
            if (found_match[iVar7] == false) {
              iVar3 = iVar7;
              if (*(long *)local_b8 != 0) {
                iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                bVar12 = false;
              }
              else {
                bVar12 = (*(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8) >> (iVar3 & 0x3f) & 1) == 0;
              }
              if (rcount != 0) {
                iVar11 = 0;
                do {
                  iVar8 = iVar11;
                  if (*(long *)local_100._0_8_ != 0) {
                    iVar8 = (idx_t)*(uint *)(*(long *)local_100._0_8_ + iVar11 * 4);
                  }
                  if ((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) {
                    bVar13 = false;
                  }
                  else {
                    bVar13 = (*(ulong *)((long)local_f0[0].sel_vector + (iVar8 >> 6) * 8) >>
                              (iVar8 & 0x3f) & 1) == 0;
                  }
                  if ((bVar12 | bVar13) == 1) {
                    if (bVar12 != bVar13) {
LAB_017bda66:
                      found_match[iVar7] = true;
                      break;
                    }
                  }
                  else {
                    bVar13 = string_t::operator==
                                       ((string_t *)(local_b0._0_8_ + iVar3 * 0x10),
                                        (string_t *)(local_100._8_8_ + iVar8 * 0x10));
                    if (!bVar13) goto LAB_017bda66;
                  }
                  iVar11 = iVar11 + 1;
                } while (rcount != iVar11);
              }
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != lcount);
        }
      }
      else if (PVar1 == UINT128) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          iVar7 = 0;
          do {
            if (found_match[iVar7] == false) {
              iVar3 = iVar7;
              if (*(long *)local_b8 != 0) {
                iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                bVar12 = false;
              }
              else {
                bVar12 = (*(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8) >> (iVar3 & 0x3f) & 1) == 0;
              }
              if (rcount != 0) {
                iVar11 = 0;
                do {
                  iVar8 = iVar11;
                  if (*(long *)local_100._0_8_ != 0) {
                    iVar8 = (idx_t)*(uint *)(*(long *)local_100._0_8_ + iVar11 * 4);
                  }
                  if ((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) {
                    bVar13 = false;
                  }
                  else {
                    bVar13 = (*(ulong *)((long)local_f0[0].sel_vector + (iVar8 >> 6) * 8) >>
                              (iVar8 & 0x3f) & 1) == 0;
                  }
                  if ((bVar12 | bVar13) == 1) {
                    if (bVar12 != bVar13) {
LAB_017bd93b:
                      found_match[iVar7] = true;
                      break;
                    }
                  }
                  else {
                    bVar13 = uhugeint_t::operator==
                                       ((uhugeint_t *)(local_b0._0_8_ + iVar3 * 0x10),
                                        (uhugeint_t *)(local_100._8_8_ + iVar8 * 0x10));
                    if (!bVar13) goto LAB_017bd93b;
                  }
                  iVar11 = iVar11 + 1;
                } while (rcount != iVar11);
              }
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != lcount);
        }
      }
      else {
        if (PVar1 != INT128) goto switchD_017b7987_caseD_a;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_b8);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_100);
        if (lcount != 0) {
          iVar7 = 0;
          do {
            if (found_match[iVar7] == false) {
              iVar3 = iVar7;
              if (*(long *)local_b8 != 0) {
                iVar3 = (idx_t)*(uint *)(*(long *)local_b8 + iVar7 * 4);
              }
              if ((element_type *)local_b0._8_8_ == (element_type *)0x0) {
                bVar12 = false;
              }
              else {
                bVar12 = (*(ulong *)(local_b0._8_8_ + (iVar3 >> 6) * 8) >> (iVar3 & 0x3f) & 1) == 0;
              }
              if (rcount != 0) {
                iVar11 = 0;
                do {
                  iVar8 = iVar11;
                  if (*(long *)local_100._0_8_ != 0) {
                    iVar8 = (idx_t)*(uint *)(*(long *)local_100._0_8_ + iVar11 * 4);
                  }
                  if ((unsigned_long *)local_f0[0].sel_vector == (unsigned_long *)0x0) {
                    bVar13 = false;
                  }
                  else {
                    bVar13 = (*(ulong *)((long)local_f0[0].sel_vector + (iVar8 >> 6) * 8) >>
                              (iVar8 & 0x3f) & 1) == 0;
                  }
                  if ((bVar12 | bVar13) == 1) {
                    if (bVar12 != bVar13) {
LAB_017b8444:
                      found_match[iVar7] = true;
                      break;
                    }
                  }
                  else if ((*(long *)(local_b0._0_8_ + iVar3 * 0x10) !=
                            *(long *)(local_100._8_8_ + iVar8 * 0x10)) ||
                          (((long *)(local_b0._0_8_ + iVar3 * 0x10))[1] !=
                           *(long *)(local_100._8_8_ + iVar8 * 0x10 + 8))) goto LAB_017b8444;
                  iVar11 = iVar11 + 1;
                } while (rcount != iVar11);
              }
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != lcount);
        }
      }
    }
    if (local_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
    }
    if (local_f0[0].selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f0[0].selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
    }
    if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
    }
  }
  return;
}

Assistant:

static void MarkJoinComparisonSwitch(Vector &left, Vector &right, idx_t lcount, idx_t rcount, bool found_match[],
                                     ExpressionType comparison_type) {
	switch (left.GetType().InternalType()) {
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
	case PhysicalType::ARRAY:
		return MarkJoinNested(left, right, lcount, rcount, found_match, comparison_type);
	default:
		break;
	}
	D_ASSERT(left.GetType() == right.GetType());
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL:
		return MarkJoinSwitch<Equals>(left, right, lcount, rcount, found_match);
	case ExpressionType::COMPARE_NOTEQUAL:
		return MarkJoinSwitch<NotEquals>(left, right, lcount, rcount, found_match);
	case ExpressionType::COMPARE_LESSTHAN:
		return MarkJoinSwitch<LessThan>(left, right, lcount, rcount, found_match);
	case ExpressionType::COMPARE_GREATERTHAN:
		return MarkJoinSwitch<GreaterThan>(left, right, lcount, rcount, found_match);
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		return MarkJoinSwitch<LessThanEquals>(left, right, lcount, rcount, found_match);
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		return MarkJoinSwitch<GreaterThanEquals>(left, right, lcount, rcount, found_match);
	case ExpressionType::COMPARE_DISTINCT_FROM:
		return MarkJoinSwitch<DistinctFrom>(left, right, lcount, rcount, found_match);
	default:
		throw NotImplementedException("Unimplemented comparison type for join!");
	}
}